

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O0

void __thiscall Js::ConstructorCache::EnableAfterTypeUpdate(ConstructorCache *this)

{
  short sVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  uint16 uVar5;
  int iVar6;
  undefined4 *puVar7;
  intptr_t iVar8;
  DynamicType *pDVar9;
  DynamicTypeHandler *pDVar10;
  DynamicType **ppDVar11;
  nullptr_t local_20;
  DynamicType *local_18;
  DynamicType *pendingType;
  ConstructorCache *this_local;
  
  pendingType = (DynamicType *)this;
  bVar4 = IsConsistent(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x89,"(IsConsistent())","IsConsistent()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((this->content).field_0x14 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8a,"(this->content.isPopulated)","this->content.isPopulated");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar4 = IsEnabled(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8b,"(!IsEnabled())","!IsEnabled()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar8 = PropertyGuard::GetValue(&this->super_PropertyGuard);
  if (iVar8 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8c,
                                "((CtorCacheGuardValues)this->GetValue() == CtorCacheGuardValues::Special)"
                                ,
                                "(CtorCacheGuardValues)this->GetValue() == CtorCacheGuardValues::Special"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((byte)(this->content).field_0x14 >> 2 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8d,"(this->content.typeUpdatePending)",
                                "this->content.typeUpdatePending");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar2 = (this->content).slotCount;
  pDVar9 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->(&(this->content).pendingType);
  pDVar10 = DynamicType::GetTypeHandler(pDVar9);
  iVar6 = DynamicTypeHandler::GetSlotCapacity(pDVar10);
  if (iVar2 != iVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8e,
                                "(this->content.slotCount == this->content.pendingType->GetTypeHandler()->GetSlotCapacity())"
                                ,
                                "this->content.slotCount == this->content.pendingType->GetTypeHandler()->GetSlotCapacity()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  sVar1 = (this->content).inlineSlotCount;
  pDVar9 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->(&(this->content).pendingType);
  pDVar10 = DynamicType::GetTypeHandler(pDVar9);
  uVar5 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar10);
  if ((int)sVar1 != (uint)uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8f,
                                "(this->content.inlineSlotCount == this->content.pendingType->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "this->content.inlineSlotCount == this->content.pendingType->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pDVar9 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->(&(this->content).pendingType);
  bVar4 = DynamicType::GetIsShared(pDVar9);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x90,"(this->content.pendingType->GetIsShared())",
                                "this->content.pendingType->GetIsShared()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ppDVar11 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                       ((WriteBarrierPtr *)&(this->content).pendingType);
  local_18 = *ppDVar11;
  PropertyGuard::SetValue(&this->super_PropertyGuard,(intptr_t)local_18);
  (this->content).field_0x14 = (this->content).field_0x14 & 0xdf | 0x20;
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicType>::operator=(&(this->content).pendingType,&local_20);
  (this->content).field_0x14 = (this->content).field_0x14 & 0xfb;
  bVar4 = IsConsistent(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x96,"(IsConsistent())","IsConsistent()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::EnableAfterTypeUpdate()
    {
        Assert(IsConsistent());
        Assert(this->content.isPopulated);
        Assert(!IsEnabled());
        Assert((CtorCacheGuardValues)this->GetValue() == CtorCacheGuardValues::Special);
        Assert(this->content.typeUpdatePending);
        Assert(this->content.slotCount == this->content.pendingType->GetTypeHandler()->GetSlotCapacity());
        Assert(this->content.inlineSlotCount == this->content.pendingType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(this->content.pendingType->GetIsShared());
        DynamicType* pendingType = this->content.pendingType;
        this->SetValue((intptr_t)pendingType);
        this->content.typeIsFinal = true;
        this->content.pendingType = nullptr;
        this->content.typeUpdatePending = false;
        Assert(IsConsistent());
    }